

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_ClassArray<ON_wString> *a)

{
  ON_wString *s;
  bool local_31;
  int local_24;
  bool local_1d;
  int i;
  bool rc;
  ON_ClassArray<ON_wString> *pOStack_18;
  int count;
  ON_ClassArray<ON_wString> *a_local;
  ON_BinaryArchive *this_local;
  
  pOStack_18 = a;
  a_local = (ON_ClassArray<ON_wString> *)this;
  ON_ClassArray<ON_wString>::Empty(a);
  i = 0;
  local_1d = ReadInt(this,&i);
  if ((local_1d) && (0 < i)) {
    ON_ClassArray<ON_wString>::SetCapacity(pOStack_18,(long)i);
    local_24 = 0;
    while( true ) {
      local_31 = false;
      if (local_24 < i) {
        local_31 = local_1d;
      }
      if (local_31 == false) break;
      s = ON_ClassArray<ON_wString>::AppendNew(pOStack_18);
      local_1d = ReadString(this,s);
      local_24 = local_24 + 1;
    }
  }
  return local_1d;
}

Assistant:

bool 
ON_BinaryArchive::ReadArray( ON_ClassArray<ON_wString>& a)
{
  a.Empty();
  int count = 0;
  bool rc = ReadInt( &count );
  if ( rc && count > 0 )
  {
    a.SetCapacity( count );
    int i;
    for ( i = 0; i < count && rc; i++ )
    {
      rc = ReadString( a.AppendNew() );
    }
  }
  return rc;
}